

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O2

float __thiscall
gimage::GaussKernel::convolveHorizontal<unsigned_short>
          (GaussKernel *this,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,
          long i,long k,int d)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  iVar2 = this->kn2;
  if (i < image->width - (long)iVar2 && iVar2 <= i) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)this->kn;
    if (this->kn < 1) {
      uVar3 = uVar4;
    }
    fVar7 = 0.0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      fVar7 = fVar7 + (float)image->img[d][k][(long)((int)i - iVar2) + uVar4] * this->kernel[uVar4];
    }
  }
  else {
    uVar4 = 0;
    uVar3 = (ulong)(uint)this->kn;
    if (this->kn < 1) {
      uVar3 = uVar4;
    }
    fVar7 = 0.0;
    fVar8 = 0.0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      uVar5 = ((int)i - iVar2) + (int)uVar4;
      if ((-1 < (int)uVar5) && (uVar6 = (ulong)(uVar5 & 0x7fffffff), (long)uVar6 < image->width)) {
        fVar1 = this->kernel[uVar4];
        fVar7 = fVar7 + (float)image->img[d][k][uVar6] * fVar1;
        fVar8 = fVar8 + fVar1;
      }
    }
    fVar7 = fVar7 / fVar8;
  }
  return fVar7;
}

Assistant:

inline float convolveHorizontal(const Image<T> &image,
        long i, long k, int d) const
    {
      if (i >= kn2 && i < image.getWidth()-kn2)
      {
        float pv=0;

        int jj=i-kn2;
        for (long j=0; j<kn; j++)
        {
          pv+=kernel[j]*image.get(jj++, k, d);
        }

        return pv;
      }
      else
      {
        float pv=0;
        float ps=0;

        for (long j=0; j<kn; j++)
        {
          int jj=i-kn2+j;

          if (jj >= 0 && jj < image.getWidth())
          {
            pv+=kernel[j]*image.get(jj, k, d);
            ps+=kernel[j];
          }
        }

        return pv/ps;
      }
    }